

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmListFileCache.cxx
# Opt level: O0

cmListFileBacktrace __thiscall cmListFileBacktrace::Push(cmListFileBacktrace *this,string *file)

{
  long in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  cmListFileBacktrace cVar1;
  undefined1 local_68 [8];
  cmListFileContext lfc;
  string *file_local;
  cmListFileBacktrace *this_local;
  
  lfc.Line = in_RDX;
  cmListFileContext::cmListFileContext((cmListFileContext *)local_68);
  std::__cxx11::string::operator=((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)lfc.Line);
  Push(this,(cmListFileContext *)file);
  cmListFileContext::~cmListFileContext((cmListFileContext *)local_68);
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  cVar1.TopEntry.super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)this;
  return (cmListFileBacktrace)
         cVar1.TopEntry.
         super___shared_ptr<const_cmListFileBacktrace::Entry,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

cmListFileBacktrace cmListFileBacktrace::Push(std::string const& file) const
{
  // We are entering a file-level scope but have not yet reached
  // any specific line or command invocation within it.  This context
  // is useful to print when it is at the top but otherwise can be
  // skipped during call stack printing.
  cmListFileContext lfc;
  lfc.FilePath = file;
  return this->Push(lfc);
}